

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_ext(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t value;
  uint32_t srcidx;
  uint32_t srcidx_00;
  uint32_t destidx;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_dest_00;
  EltPosns *local_80;
  EltPosns *elt;
  EltPosns eltposns [4];
  TCGv_i64 tcg_hh;
  TCGv_i64 tcg_resh;
  TCGv_i64 tcg_resl;
  int pos;
  int rd;
  int rn;
  int rm;
  int imm4;
  int op2;
  int is_q;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,0x1e,1);
  uVar3 = extract32(insn,0x16,2);
  value = extract32(insn,0xb,4);
  srcidx = extract32(insn,0x10,5);
  srcidx_00 = extract32(insn,5,5);
  destidx = extract32(insn,0,5);
  tcg_resl._4_4_ = value * 8;
  if ((uVar3 == 0) && ((uVar2 != 0 || (uVar3 = extract32(value,3,1), uVar3 == 0)))) {
    _Var1 = fp_access_check(s);
    if (_Var1) {
      tcg_dest = tcg_temp_new_i64(tcg_ctx_00);
      tcg_dest_00 = tcg_temp_new_i64(tcg_ctx_00);
      if (uVar2 == 0) {
        read_vec_element(s,tcg_dest_00,srcidx_00,0,MO_64);
        if (tcg_resl._4_4_ != 0) {
          read_vec_element(s,tcg_dest,srcidx,0,MO_64);
          do_ext64(s,tcg_dest,tcg_dest_00,tcg_resl._4_4_);
        }
        tcg_gen_movi_i64_aarch64(tcg_ctx_00,tcg_dest,0);
      }
      else {
        elt._4_4_ = 0;
        eltposns[0].elt = 1;
        eltposns[1].elt = 0;
        eltposns[2].elt = 1;
        local_80 = (EltPosns *)&elt;
        if (0x3f < tcg_resl._4_4_) {
          local_80 = eltposns;
          tcg_resl._4_4_ = tcg_resl._4_4_ + -0x40;
        }
        elt._0_4_ = srcidx_00;
        eltposns[0].reg = srcidx_00;
        eltposns[1].reg = srcidx;
        eltposns[2].reg = srcidx;
        read_vec_element(s,tcg_dest_00,local_80->reg,local_80->elt,MO_64);
        read_vec_element(s,tcg_dest,local_80[1].reg,local_80[1].elt,MO_64);
        if (tcg_resl._4_4_ != 0) {
          do_ext64(s,tcg_dest,tcg_dest_00,tcg_resl._4_4_);
          eltposns[3] = (EltPosns)tcg_temp_new_i64(tcg_ctx_00);
          read_vec_element(s,(TCGv_i64)eltposns[3],local_80[2].reg,local_80[2].elt,MO_64);
          do_ext64(s,(TCGv_i64)eltposns[3],tcg_dest,tcg_resl._4_4_);
          tcg_temp_free_i64(tcg_ctx_00,(TCGv_i64)eltposns[3]);
        }
      }
      write_vec_element(s,tcg_dest_00,destidx,0,MO_64);
      tcg_temp_free_i64(tcg_ctx_00,tcg_dest_00);
      write_vec_element(s,tcg_dest,destidx,1,MO_64);
      tcg_temp_free_i64(tcg_ctx_00,tcg_dest);
      clear_vec_high(s,true,destidx);
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_simd_ext(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int is_q = extract32(insn, 30, 1);
    int op2 = extract32(insn, 22, 2);
    int imm4 = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int pos = imm4 << 3;
    TCGv_i64 tcg_resl, tcg_resh;

    if (op2 != 0 || (!is_q && extract32(imm4, 3, 1))) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_resh = tcg_temp_new_i64(tcg_ctx);
    tcg_resl = tcg_temp_new_i64(tcg_ctx);

    /* Vd gets bits starting at pos bits into Vm:Vn. This is
     * either extracting 128 bits from a 128:128 concatenation, or
     * extracting 64 bits from a 64:64 concatenation.
     */
    if (!is_q) {
        read_vec_element(s, tcg_resl, rn, 0, MO_64);
        if (pos != 0) {
            read_vec_element(s, tcg_resh, rm, 0, MO_64);
            do_ext64(s, tcg_resh, tcg_resl, pos);
        }
        tcg_gen_movi_i64(tcg_ctx, tcg_resh, 0);
    } else {
        TCGv_i64 tcg_hh;
        typedef struct {
            int reg;
            int elt;
        } EltPosns;
        EltPosns eltposns[] = { {rn, 0}, {rn, 1}, {rm, 0}, {rm, 1} };
        EltPosns *elt = eltposns;

        if (pos >= 64) {
            elt++;
            pos -= 64;
        }

        read_vec_element(s, tcg_resl, elt->reg, elt->elt, MO_64);
        elt++;
        read_vec_element(s, tcg_resh, elt->reg, elt->elt, MO_64);
        elt++;
        if (pos != 0) {
            do_ext64(s, tcg_resh, tcg_resl, pos);
            tcg_hh = tcg_temp_new_i64(tcg_ctx);
            read_vec_element(s, tcg_hh, elt->reg, elt->elt, MO_64);
            do_ext64(s, tcg_hh, tcg_resh, pos);
            tcg_temp_free_i64(tcg_ctx, tcg_hh);
        }
    }

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}